

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O2

void __thiscall spvtools::opt::SSAPropagator::Initialize(SSAPropagator *this,Function *fn)

{
  BasicBlock *this_00;
  pointer pEVar1;
  bool bVar2;
  CFG *pCVar3;
  mapped_type *pmVar4;
  value_type *const_block;
  Edge *e;
  pointer puVar5;
  pointer edge;
  pointer puVar6;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_70;
  _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_68;
  pointer local_60;
  _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  pCVar3 = IRContext::cfg(this->ctx_);
  local_70._M_head_impl = &pCVar3->pseudo_entry_block_;
  local_68 = (_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->bb_succs_;
  pmVar4 = std::__detail::
           _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->bb_succs_,&local_70._M_head_impl);
  pCVar3 = IRContext::cfg(this->ctx_);
  Edge::Edge((Edge *)&local_50,&pCVar3->pseudo_entry_block_,
             (BasicBlock *)
             (((fn->blocks_).
               super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t);
  std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::
  emplace_back<spvtools::opt::Edge>(pmVar4,(Edge *)&local_50);
  puVar5 = (fn->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = (_Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->bb_preds_;
  local_60 = puVar5;
  for (puVar6 = (fn->blocks_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar5; puVar6 = puVar6 + 1) {
    this_00 = (puVar6->_M_t).
              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    local_38 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/propagator.cpp:218:39)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/propagator.cpp:218:39)>
               ::_M_manager;
    local_50._M_unused._M_object = this;
    local_50._8_8_ = this_00;
    BasicBlock::ForEachSuccessorLabel(this_00,(function<void_(unsigned_int)> *)&local_50);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
    bVar2 = BasicBlock::IsReturnOrAbort(this_00);
    if (bVar2) {
      local_70._M_head_impl = this_00;
      pmVar4 = std::__detail::
               _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_68,&local_70._M_head_impl);
      pCVar3 = IRContext::cfg(this->ctx_);
      Edge::Edge((Edge *)&local_50,this_00,&pCVar3->pseudo_exit_block_);
      std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::
      emplace_back<spvtools::opt::Edge>(pmVar4,(Edge *)&local_50);
      pCVar3 = IRContext::cfg(this->ctx_);
      local_70._M_head_impl = &pCVar3->pseudo_exit_block_;
      pmVar4 = std::__detail::
               _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_58,&local_70._M_head_impl);
      pCVar3 = IRContext::cfg(this->ctx_);
      Edge::Edge((Edge *)&local_50,&pCVar3->pseudo_exit_block_,this_00);
      puVar5 = local_60;
      std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::
      emplace_back<spvtools::opt::Edge>(pmVar4,(Edge *)&local_50);
    }
  }
  pCVar3 = IRContext::cfg(this->ctx_);
  local_50._M_unused._M_object = &pCVar3->pseudo_entry_block_;
  pmVar4 = std::__detail::
           _Map_base<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](local_68,(key_type *)&local_50);
  pEVar1 = (pmVar4->super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (edge = (pmVar4->super__Vector_base<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>
              )._M_impl.super__Vector_impl_data._M_start; edge != pEVar1; edge = edge + 1) {
    AddControlEdge(this,edge);
  }
  return;
}

Assistant:

void SSAPropagator::Initialize(Function* fn) {
  // Compute predecessor and successor blocks for every block in |fn|'s CFG.
  // TODO(dnovillo): Move this to CFG and always build them. Alternately,
  // move it to IRContext and build CFG preds/succs on-demand.
  bb_succs_[ctx_->cfg()->pseudo_entry_block()].push_back(
      Edge(ctx_->cfg()->pseudo_entry_block(), fn->entry().get()));

  for (auto& block : *fn) {
    const auto& const_block = block;
    const_block.ForEachSuccessorLabel([this, &block](const uint32_t label_id) {
      BasicBlock* succ_bb =
          ctx_->get_instr_block(get_def_use_mgr()->GetDef(label_id));
      bb_succs_[&block].push_back(Edge(&block, succ_bb));
      bb_preds_[succ_bb].push_back(Edge(succ_bb, &block));
    });
    if (block.IsReturnOrAbort()) {
      bb_succs_[&block].push_back(
          Edge(&block, ctx_->cfg()->pseudo_exit_block()));
      bb_preds_[ctx_->cfg()->pseudo_exit_block()].push_back(
          Edge(ctx_->cfg()->pseudo_exit_block(), &block));
    }
  }

  // Add the edges out of the entry block to seed the propagator.
  const auto& entry_succs = bb_succs_[ctx_->cfg()->pseudo_entry_block()];
  for (const auto& e : entry_succs) {
    AddControlEdge(e);
  }
}